

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O1

QSize __thiscall QSizeF::toSize(QSizeF *this)

{
  ulong uVar1;
  undefined4 in_EDX;
  uint uVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar4._0_8_ = (double)((ulong)this->wd & 0x8000000000000000 | 0x3fe0000000000000) + this->wd;
  auVar4._8_8_ = (double)((ulong)this->ht & 0x8000000000000000 | 0x3fe0000000000000) + this->ht;
  auVar4 = minpd(_DAT_0066f5d0,auVar4);
  auVar5._8_8_ = -(ulong)(-2147483648.0 < auVar4._8_8_);
  auVar5._0_8_ = -(ulong)(-2147483648.0 < auVar4._0_8_);
  uVar2 = movmskpd(in_EDX,auVar5);
  uVar3 = 0x8000000000000000;
  if ((uVar2 & 2) != 0) {
    uVar3 = (ulong)(uint)(int)auVar4._8_8_ << 0x20;
  }
  uVar1 = 0x80000000;
  if ((uVar2 & 1) != 0) {
    uVar1 = (ulong)(uint)(int)auVar4._0_8_;
  }
  return (QSize)(uVar1 | uVar3);
}

Assistant:

constexpr inline QSize QSizeF::toSize() const noexcept
{
    return QSize(QtPrivate::qSaturateRound(wd), QtPrivate::qSaturateRound(ht));
}